

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O3

int __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>_>
::access(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>_>
         *this,char *__name,int __type)

{
  uint uVar1;
  uint uVar2;
  int extraout_EAX;
  uint uVar3;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  byte bVar4;
  char cVar5;
  bool bVar6;
  
  uVar1 = (uint)__name;
  if ((uVar1 + 0x3d00 & 0xffff) < 0xd00) {
    bVar4 = 0;
    if ((uVar1 & 0xcf00) == 0xc300) {
      bVar4 = (this->switches_).slot_C3_rom ^ 1;
    }
    (this->switches_).internal_C8_rom =
         (uVar1 & 0xffff) != 0xcfff && ((this->switches_).internal_C8_rom != false || bVar4 != 0);
    set_card_paging(this);
    return extraout_EAX;
  }
  uVar3 = uVar1 + 0x3fa8;
  if (0xffa7 < (ushort)uVar3) {
    uVar2 = uVar1 & 0xffff;
    bVar6 = SUB81(__name,0);
    uVar3 = 0x4ae3dc;
    cVar5 = (char)__type;
    switch(uVar2) {
    case 0xc000:
    case 0xc001:
      if (cVar5 == '\0') {
        (this->switches_).store_80 = bVar6;
        set_main_paging(this);
        return extraout_EAX_00;
      }
      break;
    case 0xc002:
    case 0xc003:
      if (cVar5 == '\0') {
        (this->switches_).read_auxiliary_memory = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_06;
      }
      break;
    case 0xc004:
    case 0xc005:
      if (cVar5 == '\0') {
        (this->switches_).write_auxiliary_memory = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_03;
      }
      break;
    case 0xc006:
    case 0xc007:
      if (cVar5 == '\0') {
        (this->switches_).internal_CX_rom = (bool)(bVar6 & 1);
        set_card_paging(this);
        return extraout_EAX_04;
      }
      break;
    case 0xc008:
    case 0xc009:
      if (cVar5 == '\0') {
        bVar6 = (this->switches_).alternative_zero_page;
        uVar3 = (uint)bVar6;
        if ((uVar1 & 1) != (uint)bVar6) {
          (this->switches_).alternative_zero_page = SUB41(uVar1 & 1,0);
          ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::set_paging<2>
                    (this->machine_);
          return extraout_EAX_02;
        }
      }
      break;
    case 0xc00a:
    case 0xc00b:
      if (cVar5 == '\0') {
        (this->switches_).slot_C3_rom = (bool)(bVar6 & 1);
        set_card_paging(this);
        return extraout_EAX_07;
      }
      break;
    default:
      if (uVar2 - 0xc054 < 2) {
        (this->switches_).video_page_2 = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_05;
      }
      uVar3 = uVar2 - 0xc056;
      if (uVar3 < 2) {
        (this->switches_).high_resolution = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_01;
      }
    }
  }
  return uVar3;
}

Assistant:

void access(uint16_t address, bool is_read) {
			if(address >= 0xc300 && address < 0xd000) {
				switches_.internal_C8_rom |= ((address >> 8) == 0xc3) && !switches_.slot_C3_rom;
				switches_.internal_C8_rom &= (address != 0xcfff);
				set_card_paging();
				return;
			}

			if(address < 0xc000 || address >= 0xc058) return;

			switch(address) {
				default: break;

				case 0xc000: case 0xc001:
					if(!is_read) {
						switches_.store_80 = address & 1;
						set_main_paging();
					}
				break;

				case 0xc002: case 0xc003:
					if(!is_read) {
						switches_.read_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc004: case 0xc005:
					if(!is_read) {
						switches_.write_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc006: case 0xc007:
					if(!is_read) {
						switches_.internal_CX_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc008: case 0xc009: {
					const bool alternative_zero_page = address & 1;
					if(!is_read && switches_.alternative_zero_page != alternative_zero_page) {
						switches_.alternative_zero_page = alternative_zero_page;
						set_zero_page_paging();
					}
				} break;

				case 0xc00a: case 0xc00b:
					if(!is_read) {
						switches_.slot_C3_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc054: case 0xc055:
					switches_.video_page_2 = address & 1;
					set_main_paging();
				break;

				case 0xc056: case 0xc057:
					switches_.high_resolution = address & 1;
					set_main_paging();
				break;
			}
		}